

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_shmtx.c
# Opt level: O2

void ngx_shmtx_lock(ngx_shmtx_t *mtx)

{
  ngx_atomic_t nVar1;
  ngx_atomic_t *pnVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  if ((ngx_cycle->log->log_level & 0x10) != 0) {
    ngx_log_error_core(8,ngx_cycle->log,0,"shmtx lock");
  }
  do {
    pnVar2 = mtx->lock;
    if (*pnVar2 == 0) {
      LOCK();
      nVar1 = *pnVar2;
      if (nVar1 == 0) {
        *pnVar2 = (long)ngx_pid;
      }
      UNLOCK();
      if (nVar1 == 0) {
        return;
      }
    }
    uVar4 = 1;
    if (1 < ngx_ncpu) {
      for (; uVar3 = uVar4, uVar4 < mtx->spin; uVar4 = uVar4 * 2) {
        do {
          bVar5 = uVar3 != 0;
          uVar3 = uVar3 - 1;
        } while (bVar5);
        pnVar2 = mtx->lock;
        if (*pnVar2 == 0) {
          LOCK();
          nVar1 = *pnVar2;
          if (nVar1 == 0) {
            *pnVar2 = (long)ngx_pid;
          }
          UNLOCK();
          if (nVar1 == 0) {
            return;
          }
        }
      }
    }
    sched_yield();
  } while( true );
}

Assistant:

void
ngx_shmtx_lock(ngx_shmtx_t *mtx)
{
    ngx_uint_t         i, n;

    ngx_log_debug0(NGX_LOG_DEBUG_CORE, ngx_cycle->log, 0, "shmtx lock");

    for ( ;; ) {

        if (*mtx->lock == 0 && ngx_atomic_cmp_set(mtx->lock, 0, ngx_pid)) {
            return;
        }

        if (ngx_ncpu > 1) {

            for (n = 1; n < mtx->spin; n <<= 1) {

                for (i = 0; i < n; i++) {
                    ngx_cpu_pause();
                }

                if (*mtx->lock == 0
                    && ngx_atomic_cmp_set(mtx->lock, 0, ngx_pid))
                {
                    return;
                }
            }
        }

#if (NGX_HAVE_POSIX_SEM)

        if (mtx->semaphore) {
            (void) ngx_atomic_fetch_add(mtx->wait, 1);

            if (*mtx->lock == 0 && ngx_atomic_cmp_set(mtx->lock, 0, ngx_pid)) {
                (void) ngx_atomic_fetch_add(mtx->wait, -1);
                return;
            }

            ngx_log_debug1(NGX_LOG_DEBUG_CORE, ngx_cycle->log, 0,
                           "shmtx wait %uA", *mtx->wait);

            while (sem_wait(&mtx->sem) == -1) {
                ngx_err_t  err;

                err = ngx_errno;

                if (err != NGX_EINTR) {
                    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, err,
                                  "sem_wait() failed while waiting on shmtx");
                    break;
                }
            }

            ngx_log_debug0(NGX_LOG_DEBUG_CORE, ngx_cycle->log, 0,
                           "shmtx awoke");

            continue;
        }

#endif

        ngx_sched_yield();
    }
}